

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O2

void zinf_norm_error(int nrhs,SuperMatrix *X,doublecomplex *xtrue)

{
  int *piVar1;
  long lVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  doublecomplex *pdVar6;
  doublecomplex *z;
  double local_78;
  double local_70;
  doublecomplex local_48;
  
  piVar1 = (int *)X->Store;
  lVar2 = *(long *)(piVar1 + 2);
  iVar4 = 0;
  if (nrhs < 1) {
    nrhs = 0;
  }
  for (; iVar4 != nrhs; iVar4 = iVar4 + 1) {
    z = (doublecomplex *)((long)(*piVar1 * iVar4) * 0x10 + lVar2);
    local_70 = 0.0;
    local_78 = 0.0;
    pdVar6 = xtrue;
    for (lVar5 = 0; lVar5 < X->nrow; lVar5 = lVar5 + 1) {
      dVar3 = z->i - pdVar6->i;
      local_48.i._0_4_ = SUB84(dVar3,0);
      local_48.r = z->r - pdVar6->r;
      local_48.i._4_4_ = (int)((ulong)dVar3 >> 0x20);
      dVar3 = z_abs(&local_48);
      if (local_78 <= dVar3) {
        local_78 = z_abs(&local_48);
      }
      dVar3 = z_abs(z);
      if (local_70 <= dVar3) {
        local_70 = z_abs(z);
      }
      pdVar6 = pdVar6 + 1;
      z = z + 1;
    }
    printf("||X - Xtrue||/||X|| = %e\n",SUB84(local_78 / local_70,0));
  }
  return;
}

Assistant:

void zinf_norm_error(int nrhs, SuperMatrix *X, doublecomplex *xtrue)
{
    DNformat *Xstore;
    double err, xnorm;
    doublecomplex *Xmat, *soln_work;
    doublecomplex temp;
    int i, j;

    Xstore = X->Store;
    Xmat = Xstore->nzval;

    for (j = 0; j < nrhs; j++) {
      soln_work = &Xmat[j*Xstore->lda];
      err = xnorm = 0.0;
      for (i = 0; i < X->nrow; i++) {
        z_sub(&temp, &soln_work[i], &xtrue[i]);
	err = SUPERLU_MAX(err, z_abs(&temp));
	xnorm = SUPERLU_MAX(xnorm, z_abs(&soln_work[i]));
      }
      err = err / xnorm;
      printf("||X - Xtrue||/||X|| = %e\n", err);
    }
}